

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Module::updateFunctionsMap(Module *this)

{
  pointer puVar1;
  mapped_type __k;
  mapped_type *ppFVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  pointer puVar3;
  
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->functionsMap)._M_h);
  puVar1 = (this->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    __k = (puVar3->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
          ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    ppFVar2 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->functionsMap,(key_type *)__k);
    *ppFVar2 = __k;
  }
  return;
}

Assistant:

void Module::updateFunctionsMap() {
  functionsMap.clear();
  for (auto& curr : functions) {
    functionsMap[curr->name] = curr.get();
  }
}